

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynbuf.c
# Opt level: O2

CURLcode curlx_dyn_tail(dynbuf *s,size_t trail)

{
  ulong uVar1;
  CURLcode CVar2;
  
  uVar1 = s->leng;
  if (uVar1 < trail) {
    CVar2 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    CVar2 = CURLE_OK;
    if (uVar1 - trail != 0) {
      CVar2 = CURLE_OK;
      if (trail == 0) {
        if (uVar1 != 0) {
          *s->bufr = '\0';
        }
        s->leng = 0;
      }
      else {
        memmove(s->bufr,s->bufr + (uVar1 - trail),trail);
        s->leng = trail;
        s->bufr[trail] = '\0';
      }
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_dyn_tail(struct dynbuf *s, size_t trail)
{
  DEBUGASSERT(s);
  DEBUGASSERT(s->init == DYNINIT);
  DEBUGASSERT(!s->leng || s->bufr);
  if(trail > s->leng)
    return CURLE_BAD_FUNCTION_ARGUMENT;
  else if(trail == s->leng)
    return CURLE_OK;
  else if(!trail) {
    Curl_dyn_reset(s);
  }
  else {
    memmove(&s->bufr[0], &s->bufr[s->leng - trail], trail);
    s->leng = trail;
    s->bufr[s->leng] = 0;
  }
  return CURLE_OK;

}